

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

double __thiscall Imath_3_2::Matrix33<double>::determinant(Matrix33<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = this->x[1][0];
  dVar2 = this->x[1][1];
  dVar3 = this->x[2][2];
  dVar4 = this->x[1][2];
  dVar5 = this->x[2][1];
  dVar6 = this->x[2][0];
  return (dVar1 * dVar5 - dVar6 * dVar2) * this->x[0][2] +
         (dVar2 * dVar3 - dVar5 * dVar4) * this->x[0][0] +
         (dVar4 * dVar6 - dVar3 * dVar1) * this->x[0][1];
}

Assistant:

IMATH_HOSTDEVICE constexpr inline T
Matrix33<T>::determinant () const IMATH_NOEXCEPT
{
    return x[0][0] * (x[1][1] * x[2][2] - x[1][2] * x[2][1]) +
           x[0][1] * (x[1][2] * x[2][0] - x[1][0] * x[2][2]) +
           x[0][2] * (x[1][0] * x[2][1] - x[1][1] * x[2][0]);
}